

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyPoint2Point.cpp
# Opt level: O3

int __thiscall btMultiBodyPoint2Point::getIslandIdA(btMultiBodyPoint2Point *this)

{
  btMultiBody *pbVar1;
  long lVar2;
  long lVar3;
  btRigidBody *pbVar4;
  
  pbVar4 = this->m_rigidBodyA;
  if (pbVar4 == (btRigidBody *)0x0) {
    pbVar1 = (this->super_btMultiBodyConstraint).m_bodyA;
    if (pbVar1 == (btMultiBody *)0x0) {
      return -1;
    }
    pbVar4 = (btRigidBody *)pbVar1->m_baseCollider;
    if (pbVar4 == (btRigidBody *)0x0) {
      lVar2 = (long)(pbVar1->m_links).m_size;
      if (lVar2 < 1) {
        return -1;
      }
      lVar3 = 0;
      while (pbVar4 = *(btRigidBody **)
                       ((long)((pbVar1->m_links).m_data)->m_jointTorque + lVar3 + 0x1c),
            pbVar4 == (btRigidBody *)0x0) {
        lVar3 = lVar3 + 600;
        if (lVar2 * 600 - lVar3 == 0) {
          return -1;
        }
      }
    }
  }
  return (pbVar4->super_btCollisionObject).m_islandTag1;
}

Assistant:

int btMultiBodyPoint2Point::getIslandIdA() const
{
	if (m_rigidBodyA)
		return m_rigidBodyA->getIslandTag();

	if (m_bodyA)
	{
		btMultiBodyLinkCollider* col = m_bodyA->getBaseCollider();
		if (col)
			return col->getIslandTag();
		for (int i=0;i<m_bodyA->getNumLinks();i++)
		{
			if (m_bodyA->getLink(i).m_collider)
				return m_bodyA->getLink(i).m_collider->getIslandTag();
		}
	}
	return -1;
}